

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O3

double median(vector<double,_std::allocator<double>_> *values)

{
  pointer pdVar1;
  ulong uVar2;
  pointer pdVar3;
  long lVar4;
  double dVar5;
  vector<double,_std::allocator<double>_> sorted_values;
  vector<double,_std::allocator<double>_> local_28;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_28,values);
  pdVar1 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar2 = (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar4 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar3,pdVar1);
    pdVar3 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lVar4 = (long)pdVar3 -
          (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (((long)pdVar3 -
       (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start & 8U) == 0) {
    dVar5 = (*(double *)
              ((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar4 * 4 + -8) +
            *(double *)
             ((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4 * 4)) * 0.5;
  }
  else {
    dVar5 = *(double *)
             ((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4 * 4 + -4);
  }
  operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return dVar5;
}

Assistant:

double median(const std::vector<double>& values)
{
    std::vector<double> sorted_values{values};
    std::sort(sorted_values.begin(), sorted_values.end());

    if (sorted_values.size() % 2)
        return sorted_values[(sorted_values.size() - 1) / 2];
    else
        return (sorted_values[sorted_values.size() / 2 - 1] + sorted_values[sorted_values.size() / 2]) / 2.0;
}